

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

void __thiscall
Js::JavascriptLibrary::CallNativeHostPromiseRejectionTracker
          (JavascriptLibrary *this,Var promise,Var reason,bool handled)

{
  Type p_Var1;
  ScriptContext **ppSVar2;
  ScriptContext *pSVar3;
  ThreadContext *pTVar4;
  void **ppvVar5;
  Type *this_00;
  undefined1 local_68 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  void *__frameAddr;
  bool handled_local;
  Var reason_local;
  Var promise_local;
  JavascriptLibrary *this_local;
  
  if ((this->super_JavascriptLibraryBase).nativeHostPromiseRejectionTracker != (Type)0x0) {
    this_00 = &(this->super_JavascriptLibraryBase).scriptContext;
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__((WriteBarrierPtr *)this_00);
    LeaveScriptObject<true,_true,_false>::LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)
               &autoReentrancyHandler.m_savedReentrancySafeOrHandled,*ppSVar2,&this_local);
    pSVar3 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->(this_00);
    pTVar4 = ScriptContext::GetThreadContext(pSVar3);
    AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_68,pTVar4);
    p_Var1 = (this->super_JavascriptLibraryBase).nativeHostPromiseRejectionTracker;
    ppvVar5 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)
                         &(this->super_JavascriptLibraryBase).nativeHostPromiseRejectionTrackerState
                        );
    (*p_Var1)(promise,reason,handled,*ppvVar5);
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    if (*ppSVar2 != (ScriptContext *)0x0) {
      pSVar3 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                         (&(this->super_JavascriptLibraryBase).scriptContext);
      pTVar4 = ScriptContext::GetThreadContext(pSVar3);
      ThreadContext::DisposeOnLeaveScript(pTVar4);
    }
    AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_68);
    LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)
               &autoReentrancyHandler.m_savedReentrancySafeOrHandled);
  }
  return;
}

Assistant:

void JavascriptLibrary::CallNativeHostPromiseRejectionTracker(Var promise, Var reason, bool handled)
    {
        if (this->nativeHostPromiseRejectionTracker != nullptr)
        {
            BEGIN_LEAVE_SCRIPT(scriptContext);
            try
            {
                this->nativeHostPromiseRejectionTracker(promise, reason, handled, this->nativeHostPromiseRejectionTrackerState);
            }
            catch (...)
            {
                // Hosts are required not to pass exceptions back across the callback boundary. If
                // this happens, it is a bug in the host, not something that we are expected to
                // handle gracefully.
                Js::Throw::FatalInternalError();
            }
            END_LEAVE_SCRIPT(scriptContext);
        }
    }